

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool __thiscall RPCHelpMan::IsValidNumArgs(RPCHelpMan *this,size_t num_args)

{
  ulong uVar1;
  long lVar2;
  pointer pRVar3;
  variant_alternative_t<0UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    lVar7 = lVar6 + -200;
    uVar8 = (lVar6 >> 3) * 0xf83e0f83e0f83e1;
    do {
      uVar1 = uVar8 - 1;
      pRVar3 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pRVar3 >> 3) * 0xf83e0f83e0f83e1;
      if (uVar5 < uVar1 || uVar5 - uVar1 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8 - 1);
        }
        goto LAB_006fa47b;
      }
      if (*(char *)((long)&(pRVar3->m_fallback).
                           super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                           .
                           super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   + lVar7 + 0x18) == '\0') {
        pvVar4 = std::get<0ul,RPCArg::Optional,std::__cxx11::string,UniValue>
                           ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                             *)((long)&(pRVar3->m_names)._M_dataplus._M_p + lVar7));
        if (*pvVar4 == NO) goto LAB_006fa41b;
      }
      lVar7 = lVar7 + -0x108;
      uVar8 = uVar1;
    } while (uVar1 != 0);
  }
  uVar8 = 0;
LAB_006fa41b:
  if (num_args < uVar8) {
    bVar9 = false;
  }
  else {
    bVar9 = num_args <=
            (ulong)(((long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar9;
  }
LAB_006fa47b:
  __stack_chk_fail();
}

Assistant:

bool RPCHelpMan::IsValidNumArgs(size_t num_args) const
{
    size_t num_required_args = 0;
    for (size_t n = m_args.size(); n > 0; --n) {
        if (!m_args.at(n - 1).IsOptional()) {
            num_required_args = n;
            break;
        }
    }
    return num_required_args <= num_args && num_args <= m_args.size();
}